

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.cpp
# Opt level: O0

string * get_abi_cxx11_(string *__return_storage_ptr__,node *table,char *key)

{
  char *pcVar1;
  int iVar2;
  allocator local_35 [16];
  allocator local_25;
  uint local_24;
  char *pcStack_20;
  uint index;
  char *key_local;
  node *table_local;
  
  pcStack_20 = key;
  key_local = (char *)table;
  table_local = (node *)__return_storage_ptr__;
  iVar2 = lookup(table,key);
  if (iVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"CANNOT GET VALUE",local_35);
    std::allocator<char>::~allocator((allocator<char> *)local_35);
  }
  else {
    std::operator<<((ostream *)&std::cout,"EE bla");
    local_24 = hash(pcStack_20,0x1e);
    pcVar1 = *(char **)(key_local + (ulong)local_24 * 0x10 + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_25);
    std::allocator<char>::~allocator((allocator<char> *)&local_25);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get(node *table,const char* key){
    if(lookup(table, key)){
        std::cout <<"EE bla";
        unsigned index = hash(key, TABLESIZE);
        //const node *it = table[index];

        //std::cout << "\nin get func > " << it->data <<'\n';

        // Попытка установить наличие соответствующего ключа в связанном списке
/*
        while(it != NULL && strcmp(it->key, key) != 0)
        {
            it = it->next;
        }*/
        //std::cout << "\nin get func > " << it->data <<'\n';
        return table[index].data;

    }
    return "CANNOT GET VALUE";
}